

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotor.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMotor::ArchiveOUT(ChLinkMotor *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotor>(marchive);
  ChLinkMateGeneric::ArchiveOUT(&this->super_ChLinkMateGeneric,marchive);
  local_28._value = &this->m_func;
  local_28._name = "m_func";
  local_28._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_28);
  return;
}

Assistant:

void ChLinkMotor::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotor>();

    // serialize parent class
    ChLinkMateGeneric::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_func);
}